

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O3

GCcdata * lj_cdata_newx(CTState *cts,CTypeID id,CTSize sz,CTInfo info)

{
  long *plVar1;
  GCcdata *pGVar2;
  
  if ((info & 0x1c0000) != 0) {
    pGVar2 = lj_cdata_newv(cts->L,id,sz,info >> 0x10 & 0xf);
    return pGVar2;
  }
  pGVar2 = (GCcdata *)lj_mem_newgco(cts->L,sz + 8);
  pGVar2->gct = '\n';
  pGVar2->ctypeid = (uint16_t)id;
  plVar1 = (long *)((ulong)(cts->L->glref).ptr32 + 0xe0);
  *plVar1 = *plVar1 + 1;
  return pGVar2;
}

Assistant:

GCcdata *lj_cdata_newx(CTState *cts, CTypeID id, CTSize sz, CTInfo info)
{
  if (!(info & CTF_VLA) && ctype_align(info) <= CT_MEMALIGN)
    return lj_cdata_new(cts, id, sz);
  else
    return lj_cdata_newv(cts->L, id, sz, ctype_align(info));
}